

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stepper.cpp
# Opt level: O2

Button __thiscall QtMWidgets::StepperPrivate::buttonPressed(StepperPrivate *this,QPoint *pos)

{
  int iVar1;
  char cVar2;
  byte bVar3;
  Button BVar4;
  int iVar5;
  QRect QVar6;
  QRect plus;
  QRect minus;
  
  QVar6 = QWidget::rect(&this->q->super_QWidget);
  iVar5 = QVar6.x1;
  iVar1 = ((QVar6.x2 - iVar5) + 1) / 2;
  minus.y2 = QVar6.y2;
  minus._0_8_ = QVar6._0_8_;
  minus.x2 = iVar5 + iVar1 + -1;
  QVar6 = QWidget::rect(&this->q->super_QWidget);
  plus._4_12_ = QVar6._4_12_;
  plus.x1 = iVar1 + iVar5;
  cVar2 = QRect::contains((QPoint *)&minus,SUB81(pos,0));
  if (cVar2 == '\0') {
    bVar3 = QRect::contains((QPoint *)&plus,SUB81(pos,0));
    BVar4 = (uint)bVar3 * 2;
  }
  else {
    BVar4 = Minus;
  }
  return BVar4;
}

Assistant:

StepperPrivate::Button
StepperPrivate::buttonPressed( const QPoint & pos )
{
	QRect minus = q->rect();
	minus.setRight( minus.left() + minus.width() / 2 - 1 );
	QRect plus = q->rect();
	plus.setLeft( minus.right() + 1 );

	if( minus.contains( pos ) )
		return Minus;
	else if( plus.contains( pos ) )
		return Plus;
	else
		return NoButton;
}